

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void __thiscall
trun::TestResponseProxy::CaseDepends(TestResponseProxy *this,char *caseName,char *dependencyList)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  bool bVar1;
  element_type *this_00;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  Ref testModule;
  char *dependencyList_local;
  char *caseName_local;
  TestResponseProxy *this_local;
  
  testModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dependencyList;
  TestRunner::GetCurrentTestModule();
  bVar1 = std::operator==((shared_ptr<trun::TestModule> *)local_30,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,caseName,&local_51);
    __s = testModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,(char *)__s._M_pi,&local_89);
    TestModule::AddDependencyForCase(this_00,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)local_30);
  return;
}

Assistant:

void TestResponseProxy::CaseDepends(const char *caseName, const char *dependencyList) {
    auto testModule = TestRunner::GetCurrentTestModule();
    if (testModule != nullptr) {
        testModule->AddDependencyForCase(caseName, dependencyList);
    }
}